

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O1

int __thiscall
gl4cts::SparseTexture2AllocationTestCase::init
          (SparseTexture2AllocationTestCase *this,EVP_PKEY_CTX *ctx)

{
  vector<int,_std::allocator<int>_> *this_00;
  iterator iVar1;
  pointer extraout_RAX;
  pointer piVar2;
  int local_1c [3];
  
  SparseTextureAllocationTestCase::init(&this->super_SparseTextureAllocationTestCase,ctx);
  piVar2 = (this->super_SparseTextureAllocationTestCase).mSupportedTargets.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_SparseTextureAllocationTestCase).mSupportedTargets.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
      piVar2) {
    (this->super_SparseTextureAllocationTestCase).mSupportedTargets.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish = piVar2
    ;
  }
  this_00 = &(this->super_SparseTextureAllocationTestCase).mSupportedTargets;
  local_1c[2] = 0x9100;
  iVar1._M_current =
       (this->super_SparseTextureAllocationTestCase).mSupportedTargets.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->super_SparseTextureAllocationTestCase).mSupportedTargets.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar1,local_1c + 2);
  }
  else {
    *iVar1._M_current = 0x9100;
    (this->super_SparseTextureAllocationTestCase).mSupportedTargets.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         iVar1._M_current + 1;
  }
  local_1c[1] = 0x9102;
  iVar1._M_current =
       (this->super_SparseTextureAllocationTestCase).mSupportedTargets.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->super_SparseTextureAllocationTestCase).mSupportedTargets.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar1,local_1c + 1);
  }
  else {
    *iVar1._M_current = 0x9102;
    (this->super_SparseTextureAllocationTestCase).mSupportedTargets.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         iVar1._M_current + 1;
  }
  piVar2 = (this->super_SparseTextureAllocationTestCase).mFullArrayTargets.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_SparseTextureAllocationTestCase).mFullArrayTargets.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
      piVar2) {
    (this->super_SparseTextureAllocationTestCase).mFullArrayTargets.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish = piVar2
    ;
  }
  local_1c[0] = 0x9102;
  iVar1._M_current =
       (this->super_SparseTextureAllocationTestCase).mFullArrayTargets.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->super_SparseTextureAllocationTestCase).mFullArrayTargets.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&(this->super_SparseTextureAllocationTestCase).mFullArrayTargets,iVar1,local_1c);
    piVar2 = extraout_RAX;
  }
  else {
    *iVar1._M_current = 0x9102;
    (this->super_SparseTextureAllocationTestCase).mFullArrayTargets.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         iVar1._M_current + 1;
  }
  return (int)piVar2;
}

Assistant:

void SparseTexture2AllocationTestCase::init()
{
	SparseTextureAllocationTestCase::init();

	mSupportedTargets.clear();
	mSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE);
	mSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE_ARRAY);

	mFullArrayTargets.clear();
	mFullArrayTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE_ARRAY);
}